

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sse_avx2.c
# Opt level: O2

void sse_w8x2_avx2(uint8_t *a,int a_stride,uint8_t *b,int b_stride,__m256i *sum)

{
  __m256i alVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(a + a_stride);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)a;
  auVar4 = vpunpcklqdq_avx(auVar5,auVar4);
  auVar2 = vpmovzxbw_avx2(auVar4);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(b + b_stride);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)b;
  auVar4 = vpunpcklqdq_avx(auVar7,auVar6);
  auVar3 = vpmovzxbw_avx2(auVar4);
  auVar2 = vpsubw_avx2(auVar2,auVar3);
  auVar2 = vpmaddwd_avx2(auVar2,auVar2);
  alVar1 = (__m256i)vpaddd_avx2(auVar2,(undefined1  [32])*sum);
  *sum = alVar1;
  return;
}

Assistant:

static inline void sse_w8x2_avx2(const uint8_t *a, int a_stride,
                                 const uint8_t *b, int b_stride, __m256i *sum) {
  const __m128i v_a0 = xx_loadl_64(a);
  const __m128i v_a1 = xx_loadl_64(a + a_stride);
  const __m128i v_b0 = xx_loadl_64(b);
  const __m128i v_b1 = xx_loadl_64(b + b_stride);
  const __m256i v_a_w = _mm256_cvtepu8_epi16(_mm_unpacklo_epi64(v_a0, v_a1));
  const __m256i v_b_w = _mm256_cvtepu8_epi16(_mm_unpacklo_epi64(v_b0, v_b1));
  const __m256i v_d_w = _mm256_sub_epi16(v_a_w, v_b_w);
  *sum = _mm256_add_epi32(*sum, _mm256_madd_epi16(v_d_w, v_d_w));
}